

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

uint64_t __thiscall helics::CommonCore::receiveCountAny(CommonCore *this,LocalFederateId federateID)

{
  string_view message;
  FederateStates FVar1;
  FederateState *pFVar2;
  undefined8 uVar3;
  undefined4 in_ESI;
  LocalFederateId unaff_retaddr;
  FederateState *in_stack_00000020;
  FederateState *fed;
  char *in_stack_ffffffffffffffc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  CommonCore *in_stack_fffffffffffffff8;
  uint64_t uVar4;
  
  pFVar2 = getFederateAt(in_stack_fffffffffffffff8,unaff_retaddr);
  if (pFVar2 == (FederateState *)0x0) {
    uVar3 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    message._M_len._4_4_ = in_ESI;
    message._M_len._0_4_ = in_stack_ffffffffffffffd8;
    message._M_str = (char *)pFVar2;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_ffffffffffffffd0,message);
    __cxa_throw(uVar3,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  FVar1 = FederateState::getState((FederateState *)0x49a3e6);
  if (FVar1 == CREATED) {
    uVar4 = 0;
  }
  else {
    uVar4 = FederateState::getQueueSize(in_stack_00000020);
  }
  return uVar4;
}

Assistant:

uint64_t CommonCore::receiveCountAny(LocalFederateId federateID)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("FederateID is not valid (receiveCountAny)"));
    }
    if (fed->getState() == FederateStates::CREATED) {
        return 0;
    }

    return fed->getQueueSize();
}